

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::CTableFunctionInit(duckdb *this,ClientContext *context,TableFunctionInitInput *data_p)

{
  FunctionData *pFVar1;
  _Head_base<0UL,_duckdb::CTableGlobalInitData_*,_false> _Var2;
  pointer pCVar3;
  InvalidInputException *this_00;
  templated_unique_single_t result;
  CTableInternalInitInfo init_info;
  _Head_base<0UL,_duckdb::CTableGlobalInitData_*,_false> local_70;
  FunctionData *local_68;
  CTableInitData *local_60;
  vector<unsigned_long,_true> *local_58;
  TableFilterSet *local_50;
  char local_48;
  string local_40;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
  pFVar1 = (data_p->bind_data).ptr;
  local_70._M_head_impl = (CTableGlobalInitData *)operator_new(0x20);
  ((local_70._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)0x0;
  ((local_70._M_head_impl)->init_data).init_data = (void *)0x0;
  ((local_70._M_head_impl)->init_data).delete_callback = (duckdb_delete_callback_t)0x0;
  ((local_70._M_head_impl)->init_data).max_threads = 0;
  ((local_70._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__CTableGlobalInitData_019c9510;
  ((local_70._M_head_impl)->init_data).init_data = (void *)0x0;
  ((local_70._M_head_impl)->init_data).delete_callback = (duckdb_delete_callback_t)0x0;
  ((local_70._M_head_impl)->init_data).max_threads = 1;
  pCVar3 = unique_ptr<duckdb::CTableGlobalInitData,_std::default_delete<duckdb::CTableGlobalInitData>,_true>
           ::operator->((unique_ptr<duckdb::CTableGlobalInitData,_std::default_delete<duckdb::CTableGlobalInitData>,_true>
                         *)&local_70);
  local_60 = &pCVar3->init_data;
  local_50 = (data_p->filters).ptr;
  local_58 = &data_p->column_ids;
  local_48 = '\x01';
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_68 = pFVar1;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  (*pFVar1[4]._vptr_FunctionData[2])(&local_68);
  _Var2._M_head_impl = local_70._M_head_impl;
  if (local_48 != '\0') {
    local_70._M_head_impl = (CTableGlobalInitData *)0x0;
    *(CTableGlobalInitData **)this = _Var2._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (local_70._M_head_impl != (CTableGlobalInitData *)0x0) {
      (*((local_70._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])
                ();
    }
    return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
              )this;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this_00,&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<GlobalTableFunctionState> CTableFunctionInit(ClientContext &context, TableFunctionInitInput &data_p) {
	auto &bind_data = data_p.bind_data->Cast<CTableBindData>();
	auto result = make_uniq<CTableGlobalInitData>();

	CTableInternalInitInfo init_info(bind_data, result->init_data, data_p.column_ids, data_p.filters);
	bind_data.info.init(ToCInitInfo(init_info));
	if (!init_info.success) {
		throw InvalidInputException(init_info.error);
	}
	return std::move(result);
}